

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chan.h
# Opt level: O0

int __thiscall
dap::Chan<std::function<void_()>_>::close(Chan<std::function<void_()>_> *this,int __fd)

{
  int extraout_EAX;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  Chan<std::function<void_()>_> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mutex);
  this->closed = true;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return extraout_EAX;
}

Assistant:

void Chan<T>::close() {
  std::unique_lock<std::mutex> lock(mutex);
  closed = true;
  cv.notify_all();
}